

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O3

Tensor * __thiscall cnn::Tensor::batch_elem(Tensor *__return_storage_ptr__,Tensor *this,uint b)

{
  uint uVar1;
  float *pfVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  ushort uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  int iVar24;
  
  uVar1 = (this->d).bd;
  if (uVar1 == 1) {
    uVar6 = *(undefined8 *)(this->d).d;
    uVar9 = *(undefined8 *)((this->d).d + 2);
    uVar10 = *(undefined8 *)((this->d).d + 4);
    uVar11 = *(undefined8 *)((this->d).d + 6);
    uVar12 = *(undefined8 *)((this->d).d + 6);
    uVar13 = *(undefined8 *)&(this->d).bd;
    pfVar2 = this->v;
    *(undefined8 *)((__return_storage_ptr__->d).d + 4) = *(undefined8 *)((this->d).d + 4);
    *(undefined8 *)((__return_storage_ptr__->d).d + 6) = uVar12;
    *(undefined8 *)&(__return_storage_ptr__->d).bd = uVar13;
    __return_storage_ptr__->v = pfVar2;
    *(undefined8 *)(__return_storage_ptr__->d).d = uVar6;
    *(undefined8 *)((__return_storage_ptr__->d).d + 2) = uVar9;
    *(undefined8 *)((__return_storage_ptr__->d).d + 4) = uVar10;
    *(undefined8 *)((__return_storage_ptr__->d).d + 6) = uVar11;
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector
              (&__return_storage_ptr__->bs,&this->bs);
  }
  else {
    if (uVar1 <= b) {
      __assert_fail("b < d.batch_elems()",
                    "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/tensor.h"
                    ,0x6c,"Tensor cnn::Tensor::batch_elem(unsigned int) const");
    }
    uVar14 = (ulong)(this->d).nd;
    if (uVar14 == 0) {
      iVar24 = 1;
    }
    else {
      auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar21 = vpbroadcastq_avx512f();
      uVar15 = 0;
      do {
        auVar22 = vpbroadcastq_avx512f();
        auVar23 = vmovdqa64_avx512f(auVar18);
        auVar18 = vporq_avx512f(auVar22,auVar19);
        auVar22 = vporq_avx512f(auVar22,auVar20);
        uVar6 = vpcmpuq_avx512f(auVar22,auVar21,2);
        bVar7 = (byte)uVar6;
        uVar6 = vpcmpuq_avx512f(auVar18,auVar21,2);
        bVar8 = (byte)uVar6;
        uVar16 = CONCAT11(bVar8,bVar7);
        auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this->d).d + uVar15));
        auVar22._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar18._4_4_;
        auVar22._0_4_ = (uint)(bVar7 & 1) * auVar18._0_4_;
        auVar22._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar18._8_4_;
        auVar22._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar18._12_4_;
        auVar22._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar18._16_4_;
        auVar22._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar18._20_4_;
        auVar22._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar18._24_4_;
        auVar22._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar18._28_4_;
        auVar22._32_4_ = (uint)(bVar8 & 1) * auVar18._32_4_;
        auVar22._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar18._36_4_;
        auVar22._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar18._40_4_;
        auVar22._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar18._44_4_;
        auVar22._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar18._48_4_;
        auVar22._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar18._52_4_;
        auVar22._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar18._56_4_;
        auVar22._60_4_ = (uint)(bVar8 >> 7) * auVar18._60_4_;
        uVar15 = uVar15 + 0x10;
        auVar18 = vpmulld_avx512f(auVar22,auVar23);
      } while ((uVar14 + 0xf & 0xfffffffffffffff0) != uVar15);
      auVar18 = vmovdqa32_avx512f(auVar18);
      auVar19._0_4_ = (uint)(bVar7 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar23._0_4_;
      bVar3 = (bool)((byte)(uVar16 >> 1) & 1);
      auVar19._4_4_ = (uint)bVar3 * auVar18._4_4_ | (uint)!bVar3 * auVar23._4_4_;
      bVar3 = (bool)((byte)(uVar16 >> 2) & 1);
      auVar19._8_4_ = (uint)bVar3 * auVar18._8_4_ | (uint)!bVar3 * auVar23._8_4_;
      bVar3 = (bool)((byte)(uVar16 >> 3) & 1);
      auVar19._12_4_ = (uint)bVar3 * auVar18._12_4_ | (uint)!bVar3 * auVar23._12_4_;
      bVar3 = (bool)((byte)(uVar16 >> 4) & 1);
      auVar19._16_4_ = (uint)bVar3 * auVar18._16_4_ | (uint)!bVar3 * auVar23._16_4_;
      bVar3 = (bool)((byte)(uVar16 >> 5) & 1);
      auVar19._20_4_ = (uint)bVar3 * auVar18._20_4_ | (uint)!bVar3 * auVar23._20_4_;
      bVar3 = (bool)((byte)(uVar16 >> 6) & 1);
      auVar19._24_4_ = (uint)bVar3 * auVar18._24_4_ | (uint)!bVar3 * auVar23._24_4_;
      bVar3 = (bool)((byte)(uVar16 >> 7) & 1);
      auVar19._28_4_ = (uint)bVar3 * auVar18._28_4_ | (uint)!bVar3 * auVar23._28_4_;
      auVar19._32_4_ =
           (uint)(bVar8 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar23._32_4_;
      bVar3 = (bool)(bVar8 >> 1 & 1);
      auVar19._36_4_ = (uint)bVar3 * auVar18._36_4_ | (uint)!bVar3 * auVar23._36_4_;
      bVar3 = (bool)(bVar8 >> 2 & 1);
      auVar19._40_4_ = (uint)bVar3 * auVar18._40_4_ | (uint)!bVar3 * auVar23._40_4_;
      bVar3 = (bool)(bVar8 >> 3 & 1);
      auVar19._44_4_ = (uint)bVar3 * auVar18._44_4_ | (uint)!bVar3 * auVar23._44_4_;
      bVar3 = (bool)(bVar8 >> 4 & 1);
      auVar19._48_4_ = (uint)bVar3 * auVar18._48_4_ | (uint)!bVar3 * auVar23._48_4_;
      bVar3 = (bool)(bVar8 >> 5 & 1);
      auVar19._52_4_ = (uint)bVar3 * auVar18._52_4_ | (uint)!bVar3 * auVar23._52_4_;
      bVar3 = (bool)(bVar8 >> 6 & 1);
      auVar19._56_4_ = (uint)bVar3 * auVar18._56_4_ | (uint)!bVar3 * auVar23._56_4_;
      auVar19._60_4_ =
           (uint)(bVar8 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar23._60_4_;
      auVar17 = vextracti64x4_avx512f(auVar19,1);
      auVar18 = vpmulld_avx512f(auVar19,ZEXT3264(auVar17));
      auVar4 = vpmulld_avx(auVar18._0_16_,auVar18._16_16_);
      auVar5 = vpshufd_avx(auVar4,0xee);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(auVar4,0x55);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      iVar24 = auVar4._0_4_;
    }
    uVar6 = *(undefined8 *)((this->d).d + 2);
    uVar9 = *(undefined8 *)((this->d).d + 4);
    uVar10 = *(undefined8 *)((this->d).d + 6);
    *(undefined8 *)(__return_storage_ptr__->d).d = *(undefined8 *)(this->d).d;
    *(undefined8 *)((__return_storage_ptr__->d).d + 2) = uVar6;
    *(undefined8 *)((__return_storage_ptr__->d).d + 4) = uVar9;
    *(undefined8 *)((__return_storage_ptr__->d).d + 6) = uVar10;
    pfVar2 = this->v;
    (__return_storage_ptr__->d).bd = 1;
    __return_storage_ptr__->v = pfVar2 + iVar24 * b;
    (__return_storage_ptr__->bs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
    (__return_storage_ptr__->bs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
    (__return_storage_ptr__->bs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

Tensor batch_elem(unsigned b) const {
    if(d.batch_elems() == 1) {
      return *this;
    } else {
      assert(b < d.batch_elems());
      const unsigned bsize = d.batch_size();
      Dim new_d(d); new_d.bd = 1;
      Tensor ret(new_d, v + bsize * b);
      // std::cerr << "Getting tensor for batch " << (b % d.batch_elems()) << " bsize: " << bsize << ", ptr=" << (long)ret.v << std::endl;
      return ret;
    }
  }